

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileLibraryTargetGenerator::WriteNvidiaDeviceLibraryRules
          (cmMakefileLibraryTargetGenerator *this,string *linkRuleVar,bool relink,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *targetOutput)

{
  pointer *ppbVar1;
  bool linkScriptShell;
  cmGeneratorTarget *pcVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  cmMakefile *this_00;
  long *plVar4;
  pointer pbVar5;
  cmMakefileLibraryTargetGenerator *pcVar6;
  bool useResponseFile;
  bool forResponse;
  cmLinkLineComputer *this_01;
  string *psVar7;
  string *relDir;
  undefined7 in_register_00000011;
  char *name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *real_link_command;
  pointer pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer pbVar10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view source;
  string_view source_00;
  string_view source_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  cmMakefileLibraryTargetGenerator *local_3f8;
  undefined4 local_3ec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  cmRulePlaceholderExpander *local_3b0;
  string linkLanguage;
  cmList real_link_commands;
  string launcher;
  string linkLibs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string buildObjs;
  string linkFlags;
  string langFlags;
  string local_298;
  string objectDir;
  string ignored_;
  string val;
  string targetFullPathCompilePDB;
  string targetOutPathCompilePDB;
  string target;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libCleanFiles;
  RuleVariables vars;
  
  local_3ec = (undefined4)CONCAT71(in_register_00000011,relink);
  linkLanguage._M_dataplus._M_p = (pointer)&linkLanguage.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLanguage,"CUDA","");
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefileTargetGenerator::AppendLinkDepends
            (&this->super_cmMakefileTargetGenerator,&depends,&linkLanguage);
  langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
  langFlags._M_string_length = 0;
  langFlags.field_2._M_local_buf[0] = '\0';
  pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)&vars,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AddLanguageFlagsForLinking
            ((cmLocalGenerator *)pcVar3,&langFlags,pcVar2,&linkLanguage,(string *)&vars);
  if ((char **)vars.CMTargetName != &vars.TargetPDB) {
    operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
  }
  libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_header;
  libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cmOutputConverter::MaybeRelativeToCurBinDir
            ((string *)&vars,
             (cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
             targetOutput);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&libCleanFiles,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars);
  if ((char **)vars.CMTargetName != &vars.TargetPDB) {
    operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
  }
  linkScriptShell =
       (((this->super_cmMakefileTargetGenerator).GlobalGenerator)->super_cmGlobalCommonGenerator).
       super_cmGlobalGenerator.UseLinkScript;
  useResponseFile =
       cmMakefileTargetGenerator::CheckUseResponseFileForObjects
                 (&this->super_cmMakefileTargetGenerator,&linkLanguage);
  forResponse = cmMakefileTargetGenerator::CheckUseResponseFileForLibraries
                          (&this->super_cmMakefileTargetGenerator,&linkLanguage);
  memset(&vars,0,0x158);
  vars.Language = linkLanguage._M_dataplus._M_p;
  real_link_commands.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  real_link_commands.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  real_link_commands.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f8 = this;
  cmOutputConverter::SetLinkScriptShell
            ((cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
             linkScriptShell);
  linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
  linkLibs._M_string_length = 0;
  linkLibs.field_2._M_local_buf[0] = '\0';
  this_01 = (cmLinkLineComputer *)operator_new(0x40);
  pcVar3 = (local_3f8->super_cmMakefileTargetGenerator).LocalGenerator;
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&outputs,(cmLocalGenerator *)pcVar3);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&commands1,(cmStateSnapshot *)&outputs);
  cmLinkLineDeviceComputer::cmLinkLineDeviceComputer
            ((cmLinkLineDeviceComputer *)this_01,(cmOutputConverter *)pcVar3,
             (cmStateDirectory *)&commands1);
  cmLinkLineComputer::SetForResponse(this_01,forResponse);
  cmLinkLineComputer::SetRelink(this_01,(bool)(char)local_3ec);
  pcVar6 = local_3f8;
  linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
  linkFlags._M_string_length = 0;
  linkFlags.field_2._M_local_buf[0] = '\0';
  ignored_._M_dataplus._M_p = (pointer)&ignored_.field_2;
  ignored_._M_string_length = 0;
  ignored_.field_2._M_local_buf[0] = '\0';
  pcVar3 = (local_3f8->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)&commands1,&local_3f8->super_cmMakefileTargetGenerator);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)pcVar3,(cmLinkLineDeviceComputer *)this_01,(string *)&commands1,
             &ignored_,&linkFlags,&ignored_,&ignored_,
             (pcVar6->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
            );
  ppbVar1 = &commands1.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(commands1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((commands1.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  pcVar6 = local_3f8;
  cmMakefileTargetGenerator::CreateLinkLibs
            (&local_3f8->super_cmMakefileTargetGenerator,this_01,&linkLibs,forResponse,&depends,
             &linkLanguage,DeviceLink);
  buildObjs._M_dataplus._M_p = (pointer)&buildObjs.field_2;
  buildObjs._M_string_length = 0;
  buildObjs.field_2._M_local_buf[0] = '\0';
  cmMakefileTargetGenerator::CreateObjectLists
            (&pcVar6->super_cmMakefileTargetGenerator,linkScriptShell,false,useResponseFile,
             &buildObjs,&depends,false,&linkLanguage,DeviceLink);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&objectDir,
             (pcVar6->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
            );
  pcVar3 = (pcVar6->super_cmMakefileTargetGenerator).LocalGenerator;
  cmOutputConverter::MaybeRelativeToCurBinDir
            ((string *)&outputs,(cmOutputConverter *)pcVar3,&objectDir);
  source._M_str =
       (char *)outputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  source._M_len =
       (size_t)outputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)&commands1,(cmOutputConverter *)pcVar3,source,SHELL,false);
  std::__cxx11::string::operator=((string *)&objectDir,(string *)&commands1);
  if (commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(commands1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((commands1.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (outputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&outputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(outputs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((outputs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  pcVar3 = (pcVar6->super_cmMakefileTargetGenerator).LocalGenerator;
  cmOutputConverter::MaybeRelativeToCurBinDir
            ((string *)&commands1,(cmOutputConverter *)pcVar3,targetOutput);
  source_00._M_str =
       (char *)commands1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  source_00._M_len =
       (size_t)commands1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&target,(cmOutputConverter *)pcVar3,source_00,SHELL,false);
  if (commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(commands1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((commands1.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)&commands1,&pcVar6->super_cmMakefileTargetGenerator);
  cmCommonTargetGenerator::ComputeTargetCompilePDB
            (&targetFullPathCompilePDB,(cmCommonTargetGenerator *)pcVar6,(string *)&commands1);
  if (commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(commands1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((commands1.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  source_01._M_str = targetFullPathCompilePDB._M_dataplus._M_p;
  source_01._M_len = targetFullPathCompilePDB._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&targetOutPathCompilePDB,
             (cmOutputConverter *)(pcVar6->super_cmMakefileTargetGenerator).LocalGenerator,source_01
             ,SHELL,false);
  vars.Objects = buildObjs._M_dataplus._M_p;
  vars.ObjectDir = objectDir._M_dataplus._M_p;
  vars.Target = target._M_dataplus._M_p;
  vars.LinkLibraries = linkLibs._M_dataplus._M_p;
  vars.ObjectsQuoted = buildObjs._M_dataplus._M_p;
  vars.LanguageCompileFlags = langFlags._M_dataplus._M_p;
  vars.LinkFlags = linkFlags._M_dataplus._M_p;
  vars.TargetCompilePDB = targetOutPathCompilePDB._M_dataplus._M_p;
  launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
  launcher._M_string_length = 0;
  launcher.field_2._M_local_buf[0] = '\0';
  pcVar2 = (pcVar6->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar3 = (pcVar6->super_cmMakefileTargetGenerator).LocalGenerator;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&commands1,"RULE_LAUNCH_LINK","");
  this_00 = (pcVar6->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&outputs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&outputs,"CMAKE_BUILD_TYPE","");
  psVar7 = cmMakefile::GetSafeDefinition(this_00,(string *)&outputs);
  cmLocalGenerator::GetRuleLauncher
            (&val,(cmLocalGenerator *)pcVar3,pcVar2,(string *)&commands1,psVar7);
  if (outputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&outputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(outputs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((outputs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(commands1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((commands1.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (val._M_string_length != 0) {
    outputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)val._M_string_length;
    outputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)val._M_dataplus._M_p;
    outputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    commands1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_420;
    commands1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    commands1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
    local_420._M_dataplus._M_p._0_1_ = 0x20;
    views._M_len = 2;
    views._M_array = (iterator)&outputs;
    cmCatViews(&local_298,views);
    std::__cxx11::string::operator=((string *)&launcher,(string *)&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
  }
  (*(((pcVar6->super_cmMakefileTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
    super_cmLocalGenerator.super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_3b0);
  std::__cxx11::string::_M_assign((string *)&local_3b0->TargetImpLib);
  cmMakefileTargetGenerator::GetLinkRule
            ((string *)&outputs,&pcVar6->super_cmMakefileTargetGenerator,linkRuleVar);
  cmList::Insert(&real_link_commands.Values,
                 (const_iterator)
                 real_link_commands.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(string *)&outputs,Yes,No);
  pbVar5 = real_link_commands.Values.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (real_link_commands.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      real_link_commands.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar8 = real_link_commands.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)launcher._M_string_length;
      commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)launcher._M_dataplus._M_p;
      commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_420._M_string_length = (size_type)(pbVar8->_M_dataplus)._M_p;
      local_420._M_dataplus._M_p = (pointer)pbVar8->_M_string_length;
      local_420.field_2._0_8_ = 0;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&commands1;
      cmCatViews(&local_298,views_00);
      std::__cxx11::string::operator=((string *)pbVar8,(string *)&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (local_3b0,
                 (cmOutputConverter *)(local_3f8->super_cmMakefileTargetGenerator).LocalGenerator,
                 pbVar8,&vars);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar5);
  }
  pcVar6 = local_3f8;
  cmOutputConverter::SetLinkScriptShell
            ((cmOutputConverter *)(local_3f8->super_cmMakefileTargetGenerator).LocalGenerator,false)
  ;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&(pcVar6->super_cmMakefileTargetGenerator).CleanFiles,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&libCleanFiles._M_t._M_impl.super__Rb_tree_header);
  if (outputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&outputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(outputs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((outputs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_3b0 != (cmRulePlaceholderExpander *)0x0) {
    (*(local_3b0->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)val._M_dataplus._M_p != &val.field_2) {
    operator_delete(val._M_dataplus._M_p,val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)launcher._M_dataplus._M_p != &launcher.field_2) {
    operator_delete(launcher._M_dataplus._M_p,
                    CONCAT71(launcher.field_2._M_allocated_capacity._1_7_,
                             launcher.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutPathCompilePDB._M_dataplus._M_p != &targetOutPathCompilePDB.field_2) {
    operator_delete(targetOutPathCompilePDB._M_dataplus._M_p,
                    targetOutPathCompilePDB.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetFullPathCompilePDB._M_dataplus._M_p != &targetFullPathCompilePDB.field_2) {
    operator_delete(targetFullPathCompilePDB._M_dataplus._M_p,
                    targetFullPathCompilePDB.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)target._M_dataplus._M_p != &target.field_2) {
    operator_delete(target._M_dataplus._M_p,target.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectDir._M_dataplus._M_p != &objectDir.field_2) {
    operator_delete(objectDir._M_dataplus._M_p,objectDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)buildObjs._M_dataplus._M_p != &buildObjs.field_2) {
    operator_delete(buildObjs._M_dataplus._M_p,
                    CONCAT71(buildObjs.field_2._M_allocated_capacity._1_7_,
                             buildObjs.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ignored_._M_dataplus._M_p != &ignored_.field_2) {
    operator_delete(ignored_._M_dataplus._M_p,
                    CONCAT71(ignored_.field_2._M_allocated_capacity._1_7_,
                             ignored_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
    operator_delete(linkFlags._M_dataplus._M_p,
                    CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                             linkFlags.field_2._M_local_buf[0]) + 1);
  }
  (*this_01->_vptr_cmLinkLineComputer[1])(this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkLibs._M_dataplus._M_p != &linkLibs.field_2) {
    operator_delete(linkLibs._M_dataplus._M_p,
                    CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                             linkLibs.field_2._M_local_buf[0]) + 1);
  }
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (linkScriptShell == false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&commands1,&real_link_commands.Values);
  }
  else {
    name = "dlink.txt";
    if ((char)local_3ec != '\0') {
      name = "drelink.txt";
    }
    cmMakefileTargetGenerator::CreateLinkScript
              (&pcVar6->super_cmMakefileTargetGenerator,name,&real_link_commands.Values,&commands1,
               &depends);
  }
  pcVar3 = (pcVar6->super_cmMakefileTargetGenerator).LocalGenerator;
  psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((pcVar6->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      Makefile);
  relDir = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)(pcVar6->super_cmMakefileTargetGenerator).LocalGenerator);
  cmLocalUnixMakefileGenerator3::CreateCDCommand(pcVar3,&commands1,psVar7,relDir);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
             (commands->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             commands1.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             commands1.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pbVar8 = commands1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = commands1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar9 = &(commands1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (paVar9 + -1))->_M_dataplus)._M_p;
      if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar4) {
        operator_delete(plVar4,paVar9->_M_allocated_capacity + 1);
      }
      pbVar10 = (pointer)(paVar9 + 1);
      paVar9 = paVar9 + 2;
    } while (pbVar10 != pbVar8);
    commands1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&outputs,1,targetOutput,(allocator_type *)&linkLibs);
  cmMakefileTargetGenerator::WriteMakeRule
            (&pcVar6->super_cmMakefileTargetGenerator,
             (ostream *)
             (pcVar6->super_cmMakefileTargetGenerator).BuildFileStream._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,(char *)0x0,
             &outputs,&depends,commands,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&real_link_commands.Values);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&libCleanFiles._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)langFlags._M_dataplus._M_p != &langFlags.field_2) {
    operator_delete(langFlags._M_dataplus._M_p,
                    CONCAT71(langFlags.field_2._M_allocated_capacity._1_7_,
                             langFlags.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkLanguage._M_dataplus._M_p != &linkLanguage.field_2) {
    operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteNvidiaDeviceLibraryRules(
  const std::string& linkRuleVar, bool relink,
  std::vector<std::string>& commands, const std::string& targetOutput)
{
  std::string linkLanguage = "CUDA";

  // Build list of dependencies.
  std::vector<std::string> depends;
  this->AppendLinkDepends(depends, linkLanguage);

  // Add language-specific flags.
  std::string langFlags;
  this->LocalGenerator->AddLanguageFlagsForLinking(
    langFlags, this->GeneratorTarget, linkLanguage, this->GetConfigName());

  // Clean files associated with this library.
  std::set<std::string> libCleanFiles;
  libCleanFiles.insert(
    this->LocalGenerator->MaybeRelativeToCurBinDir(targetOutput));

  // Determine whether a link script will be used.
  bool useLinkScript = this->GlobalGenerator->GetUseLinkScript();

  bool useResponseFileForObjects =
    this->CheckUseResponseFileForObjects(linkLanguage);
  bool const useResponseFileForLibs =
    this->CheckUseResponseFileForLibraries(linkLanguage);

  cmRulePlaceholderExpander::RuleVariables vars;
  vars.Language = linkLanguage.c_str();

  // Expand the rule variables.
  cmList real_link_commands;
  {
    // Set path conversion for link script shells.
    this->LocalGenerator->SetLinkScriptShell(useLinkScript);

    // Collect up flags to link in needed libraries.
    std::string linkLibs;
    std::unique_ptr<cmLinkLineDeviceComputer> linkLineComputer(
      new cmLinkLineDeviceComputer(
        this->LocalGenerator,
        this->LocalGenerator->GetStateSnapshot().GetDirectory()));
    linkLineComputer->SetForResponse(useResponseFileForLibs);
    linkLineComputer->SetRelink(relink);

    // Create set of linking flags.
    std::string linkFlags;
    std::string ignored_;
    this->LocalGenerator->GetDeviceLinkFlags(
      *linkLineComputer, this->GetConfigName(), ignored_, linkFlags, ignored_,
      ignored_, this->GeneratorTarget);

    this->CreateLinkLibs(
      linkLineComputer.get(), linkLibs, useResponseFileForLibs, depends,
      linkLanguage, cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink);

    // Construct object file lists that may be needed to expand the
    // rule.
    std::string buildObjs;
    this->CreateObjectLists(
      useLinkScript, false, // useArchiveRules
      useResponseFileForObjects, buildObjs, depends, false, linkLanguage,
      cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink);

    std::string objectDir = this->GeneratorTarget->GetSupportDirectory();
    objectDir = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(objectDir),
      cmOutputConverter::SHELL);

    std::string target = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(targetOutput),
      cmOutputConverter::SHELL);

    std::string targetFullPathCompilePDB =
      this->ComputeTargetCompilePDB(this->GetConfigName());
    std::string targetOutPathCompilePDB =
      this->LocalGenerator->ConvertToOutputFormat(targetFullPathCompilePDB,
                                                  cmOutputConverter::SHELL);

    vars.Objects = buildObjs.c_str();
    vars.ObjectDir = objectDir.c_str();
    vars.Target = target.c_str();
    vars.LinkLibraries = linkLibs.c_str();
    vars.ObjectsQuoted = buildObjs.c_str();
    vars.LanguageCompileFlags = langFlags.c_str();
    vars.LinkFlags = linkFlags.c_str();
    vars.TargetCompilePDB = targetOutPathCompilePDB.c_str();

    std::string launcher;
    std::string val = this->LocalGenerator->GetRuleLauncher(
      this->GeneratorTarget, "RULE_LAUNCH_LINK",
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    if (cmNonempty(val)) {
      launcher = cmStrCat(val, ' ');
    }

    auto rulePlaceholderExpander =
      this->LocalGenerator->CreateRulePlaceholderExpander();

    // Construct the main link rule and expand placeholders.
    rulePlaceholderExpander->SetTargetImpLib(targetOutput);
    std::string linkRule = this->GetLinkRule(linkRuleVar);
    real_link_commands.append(linkRule);

    // Expand placeholders.
    for (auto& real_link_command : real_link_commands) {
      real_link_command = cmStrCat(launcher, real_link_command);
      rulePlaceholderExpander->ExpandRuleVariables(this->LocalGenerator,
                                                   real_link_command, vars);
    }
    // Restore path conversion to normal shells.
    this->LocalGenerator->SetLinkScriptShell(false);

    // Clean all the possible library names and symlinks.
    this->CleanFiles.insert(libCleanFiles.begin(), libCleanFiles.end());
  }

  std::vector<std::string> commands1;
  // Optionally convert the build rule to use a script to avoid long
  // command lines in the make shell.
  if (useLinkScript) {
    // Use a link script.
    const char* name = (relink ? "drelink.txt" : "dlink.txt");
    this->CreateLinkScript(name, real_link_commands, commands1, depends);
  } else {
    // No link script.  Just use the link rule directly.
    commands1 = real_link_commands;
  }
  this->LocalGenerator->CreateCDCommand(
    commands1, this->Makefile->GetCurrentBinaryDirectory(),
    this->LocalGenerator->GetBinaryDirectory());
  cm::append(commands, commands1);
  commands1.clear();

  // Compute the list of outputs.
  std::vector<std::string> outputs(1, targetOutput);

  // Write the build rule.
  this->WriteMakeRule(*this->BuildFileStream, nullptr, outputs, depends,
                      commands, false);
#else
  static_cast<void>(linkRuleVar);
  static_cast<void>(relink);
#endif
}